

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineArc.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChLineArc::Evaluate(ChLineArc *this,ChVector<double> *pos,double parU)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  ChVector<double> localP;
  ChVector<double> local_48;
  ChVector<double> local_30;
  
  dVar1 = this->angle1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar1;
  dVar5 = this->angle2;
  if (this->counterclockwise == true) {
    if (dVar5 < dVar1) {
      dVar5 = dVar5 + 6.283185307179586;
    }
  }
  else if (dVar1 < dVar5) {
    dVar5 = dVar5 + -6.283185307179586;
  }
  dVar1 = this->radius;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar5 * parU;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = 1.0 - parU;
  auVar4 = vfmadd231sd_fma(auVar3,auVar4,auVar6);
  dVar2 = cos(auVar4._0_8_);
  dVar5 = this->radius;
  local_30.m_data[1] = sin(auVar4._0_8_);
  local_30.m_data[1] = local_30.m_data[1] * dVar5;
  local_30.m_data[2] = 0.0;
  local_30.m_data[0] = dVar2 * dVar1;
  ChCoordsys<double>::TransformPointLocalToParent(&this->origin,&local_30);
  if (&local_48 != pos) {
    pos->m_data[0] = local_48.m_data[0];
    pos->m_data[1] = local_48.m_data[1];
    pos->m_data[2] = local_48.m_data[2];
  }
  return;
}

Assistant:

void ChLineArc::Evaluate(ChVector<>& pos, const double parU) const {
    double ang1 = this->angle1;
    double ang2 = this->angle2;
    if (this->counterclockwise) {
        if (ang2 < ang1)
            ang2 += CH_C_2PI;
    } else {
        if (ang2 > ang1)
            ang2 -= CH_C_2PI;
    }
    double mangle = ang1 * (1 - parU) + ang2 * (parU);
    ChVector<> localP(radius * cos(mangle), radius * sin(mangle), 0);
    pos = localP >> origin;  // transform to absolute coordinates
}